

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O3

void __thiscall nuraft::buffer_serializer::put_i64(buffer_serializer *this,int64_t val)

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  size_t sVar12;
  byte *pbVar13;
  overflow_error *this_00;
  byte bVar14;
  byte bVar15;
  bool bVar16;
  
  sVar1 = this->pos_;
  sVar12 = buffer::size(this->buf_);
  if (sVar12 < sVar1 + 8) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar13 = buffer::data_begin(this->buf_);
  bVar7 = (byte)((ulong)val >> 8);
  bVar8 = (byte)((ulong)val >> 0x10);
  bVar15 = (byte)((ulong)val >> 0x18);
  bVar16 = this->endian_ == LITTLE;
  bVar3 = (byte)val;
  bVar2 = (byte)((ulong)val >> 0x38);
  bVar9 = bVar3;
  if (bVar16) {
    bVar9 = bVar2;
  }
  bVar5 = (byte)((ulong)val >> 0x28);
  bVar4 = (byte)((ulong)val >> 0x30);
  bVar14 = bVar8;
  bVar10 = bVar7;
  if (bVar16) {
    bVar14 = bVar5;
    bVar10 = bVar4;
  }
  sVar1 = this->pos_;
  bVar6 = (byte)((ulong)val >> 0x20);
  bVar11 = bVar6;
  if (!bVar16) {
    bVar3 = bVar2;
    bVar8 = bVar5;
    bVar11 = bVar15;
    bVar15 = bVar6;
    bVar7 = bVar4;
  }
  pbVar13[sVar1] = bVar3;
  pbVar13[sVar1 + 1] = bVar7;
  pbVar13[sVar1 + 2] = bVar8;
  pbVar13[sVar1 + 3] = bVar15;
  pbVar13[sVar1 + 4] = bVar11;
  pbVar13[sVar1 + 5] = bVar14;
  pbVar13[sVar1 + 6] = bVar10;
  pbVar13[sVar1 + 7] = bVar9;
  pos(this,this->pos_ + 8);
  return;
}

Assistant:

void buffer_serializer::put_i64(int64_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put64l(val, ptr); }
    else                    { put64b(val, ptr); }
    pos( pos() + sizeof(val) );
}